

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gs.c
# Opt level: O1

int32 gs_display(char *file,gs_t *gs)

{
  uint uVar1;
  gs_t *gs_00;
  FILE *pFVar2;
  bitvec_t *val;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  float32 fVar8;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
          ,100,"Reading gaussian selector map: %s\n",file);
  gs_00 = (gs_t *)__ckd_calloc__(1,0x40,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
                                 ,0x65);
  pFVar2 = fopen(file,"rb");
  gs_00->fp = (FILE *)pFVar2;
  if (pFVar2 != (FILE *)0x0) {
    uVar1 = gs_fread_int32(gs_00);
    gs_00->n_mgau = uVar1;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x6c,"The number of mixtures of gaussian: %d\n",(ulong)uVar1);
    uVar1 = gs_fread_int32(gs_00);
    gs_00->n_feat = uVar1;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x6e,"The number of features stream: %d\n",(ulong)uVar1);
    uVar1 = gs_fread_int32(gs_00);
    gs_00->n_density = uVar1;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x70,"The number of density: %d\n",(ulong)uVar1);
    uVar1 = gs_fread_int32(gs_00);
    gs_00->n_code = uVar1;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x72,"The number of code word: %d\n",(ulong)uVar1);
    uVar1 = gs_fread_int32(gs_00);
    gs_00->n_featlen = uVar1;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x74,"The feature length: %d\n",(ulong)uVar1);
    iVar3 = gs_00->n_density + 0x1f;
    iVar6 = gs_00->n_density + 0x3e;
    if (-1 < iVar3) {
      iVar6 = iVar3;
    }
    gs_00->n_mbyte = (iVar6 >> 5) << 2;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x76,"The number of byte to read: %d\n");
    iVar3 = gs_00->n_density + 0x1f;
    iVar6 = gs_00->n_density + 0x3e;
    if (-1 < iVar3) {
      iVar6 = iVar3;
    }
    val = (bitvec_t *)
          __ckd_calloc__((long)(iVar6 >> 5),4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
                         ,0x79);
    if (0 < gs_00->n_code) {
      iVar3 = 0;
      do {
        printf("Code idx: %d\n");
        if (0 < gs_00->n_featlen) {
          iVar6 = 0;
          do {
            fVar8 = gs_fread_float32(gs_00);
            printf("%f ",(double)(float)fVar8);
            iVar6 = iVar6 + 1;
          } while (iVar6 < gs_00->n_featlen);
        }
        putchar(10);
        if (0 < gs_00->n_mgau) {
          uVar7 = 0;
          do {
            if (0 < gs_00->n_feat) {
              uVar4 = 0;
              do {
                gs_fread_bitvec_t(val,gs_00);
                printf("%d %d ",uVar7,uVar4);
                if (0 < gs_00->n_density) {
                  uVar5 = 0;
                  do {
                    if ((val[uVar5 >> 5] >> ((uint)uVar5 & 0x1f) & 1) != 0) {
                      printf("%d ",uVar5);
                    }
                    uVar1 = (uint)uVar5 + 1;
                    uVar5 = (ulong)uVar1;
                  } while ((int)uVar1 < gs_00->n_density);
                }
                putchar(10);
                uVar1 = (int)uVar4 + 1;
                uVar4 = (ulong)uVar1;
              } while ((int)uVar1 < gs_00->n_feat);
            }
            uVar1 = (int)uVar7 + 1;
            uVar7 = (ulong)uVar1;
          } while ((int)uVar1 < gs_00->n_mgau);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < gs_00->n_code);
    }
    putchar(10);
    fclose((FILE *)gs_00->fp);
    free(gs_00);
    return 1;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
          ,0x68,"fopen(%s,rb) failed\n",file);
  exit(1);
}

Assistant:

int
gs_display(char *file, gs_t * gs)
{
    int32 i;
    int32 code_id;
    int32 m_id, s_id, c_id;
    float32 tmp;
    bitvec_t *bv;

    E_INFO("Reading gaussian selector map: %s\n", file);
    gs = (gs_t *) ckd_calloc(1, sizeof(gs_t));

    if ((gs->fp = fopen(file, "rb")) == NULL)
        E_FATAL("fopen(%s,rb) failed\n", file);

    gs->n_mgau = gs_fread_int32(gs);

    E_INFO("The number of mixtures of gaussian: %d\n", gs->n_mgau);
    gs->n_feat = gs_fread_int32(gs);
    E_INFO("The number of features stream: %d\n", gs->n_feat);
    gs->n_density = gs_fread_int32(gs);
    E_INFO("The number of density: %d\n", gs->n_density);
    gs->n_code = gs_fread_int32(gs);
    E_INFO("The number of code word: %d\n", gs->n_code);
    gs->n_featlen = gs_fread_int32(gs);
    E_INFO("The feature length: %d\n", gs->n_featlen);
    gs->n_mbyte = bitvec_size(gs->n_density) * sizeof(bitvec_t);
    E_INFO("The number of byte to read: %d\n", gs->n_mbyte);

    /* allocate the bit vector here */
    bv = bitvec_alloc(gs->n_density);

    /*  for(i=0;i<gs->n_code;i++) */
    for (code_id = 0; code_id < gs->n_code; code_id++) {
        printf("Code idx: %d\n", code_id);
        for (c_id = 0; c_id < gs->n_featlen; c_id++) {
            tmp = gs_fread_float32(gs);
            printf("%f ", tmp);
        }
        printf("\n");
        for (m_id = 0; m_id < gs->n_mgau; m_id++) {
            for (s_id = 0; s_id < gs->n_feat; s_id++) {
                /*The writer currently doesn't support the byte order */
                gs_fread_bitvec_t(bv, gs);
                printf("%d %d ", m_id, s_id);

                for (i = 0; i < gs->n_density; i++) {
                    if (bitvec_is_set(bv, i)) {
                        printf("%d ", i);
                    }
                }
                printf("\n");
            }
        }
    }

    printf("\n");
    /*  bitvec_free(bv); */
    /* destroy the bit vector here */

    gs_free(gs);
    return 1;
}